

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O2

HullError __thiscall
HACD::HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  HaU32 count;
  size_t __n;
  HullResult *pHVar5;
  bool bVar6;
  ulong uVar7;
  HaF32 *vertices;
  HaF64 *vertexCloud;
  HaF32 *pHVar8;
  dgBigVector *pdVar9;
  HaU32 *pHVar10;
  HaF32 *__dest;
  HaU32 *__dest_00;
  HaU32 i;
  HaU32 i_1;
  uint uVar11;
  HullError HVar12;
  HullLibrary *this_00;
  HaI32 HVar13;
  HaF32 in_XMM0_Da;
  undefined1 auVar14 [16];
  undefined1 in_register_000012c4 [12];
  HaU32 ovcount;
  size_t local_e8;
  HaF32 *local_e0;
  HaU32 *local_d8;
  undefined8 uStack_d0;
  size_t local_c8;
  undefined8 uStack_c0;
  HaF32 *local_b8;
  HullResult *local_b0;
  HaF32 center [3];
  HaF32 scale [3];
  Iterator local_88;
  dgConvexHull3d convexHull;
  
  uVar11 = desc->mVcount;
  uVar7 = 8;
  if (8 < uVar11) {
    uVar7 = (ulong)uVar11;
  }
  vertices = (HaF32 *)malloc(uVar7 * 0xc);
  bVar6 = NormalizeAndCleanupVertices
                    ((HullLibrary *)center,uVar11,desc->mVertices,(uint)desc->mUseWuQuantizer,
                     &ovcount,vertices,in_XMM0_Da,scale,center,desc->mMaxVertices * 2,
                     desc->mUseWuQuantizer);
  count = ovcount;
  if (bVar6) {
    vertexCloud = (HaF64 *)malloc((ulong)ovcount * 0x18);
    for (uVar7 = 0; count * 3 != uVar7; uVar7 = uVar7 + 1) {
      vertexCloud[uVar7] = (HaF64)(double)(float)vertices[uVar7];
    }
    dgConvexHull3d::dgConvexHull3d
              (&convexHull,vertexCloud,0x18,count,9.999999747378752e-05,desc->mMaxVertices);
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count == 0) {
      HVar12 = QE_FAIL;
    }
    else {
      uVar7 = (ulong)convexHull.m_count;
      local_b0 = result;
      pHVar8 = (HaF32 *)malloc(uVar7 * 0xc);
      uVar11 = 0;
      local_c8._0_4_ = center[0];
      local_c8._4_4_ = center[1];
      uStack_c0 = 0;
      local_d8 = (HaU32 *)scale._0_8_;
      uStack_d0 = 0;
      local_e0 = (HaF32 *)CONCAT44(local_e0._4_4_,scale[2]);
      local_e8 = CONCAT44(local_e8._4_4_,center[2]);
      local_b8 = pHVar8;
      while (uVar11 < (uint)uVar7) {
        pdVar9 = dgArray<dgBigVector>::operator[](&convexHull.m_points,uVar11);
        auVar2._0_8_ = (pdVar9->super_dgTemplateVector<double>).m_x;
        auVar2._8_8_ = (pdVar9->super_dgTemplateVector<double>).m_y;
        auVar2 = vcvtpd2ps_avx(auVar2);
        auVar4._8_8_ = uStack_c0;
        auVar4._0_8_ = local_c8;
        uVar7 = (ulong)(uint)convexHull.m_count;
        uVar11 = uVar11 + 1;
        auVar3._8_8_ = uStack_d0;
        auVar3._0_8_ = local_d8;
        auVar2 = vfmadd132ps_fma(auVar2,auVar4,auVar3);
        uVar1 = vmovlps_avx(auVar2);
        *(undefined8 *)pHVar8 = uVar1;
        auVar14._0_4_ = (float)(pdVar9->super_dgTemplateVector<double>).m_z;
        auVar14._4_12_ = in_register_000012c4;
        auVar2 = vfmadd132ss_fma(auVar14,ZEXT416((uint)local_e8),ZEXT416((uint)local_e0));
        pHVar8[2] = auVar2._0_4_;
        pHVar8 = pHVar8 + 3;
      }
      local_c8 = (ulong)(uint)convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc;
      pHVar10 = (HaU32 *)malloc(local_c8);
      local_88.m_list = &convexHull.super_dgList<dgConvexHull3DFace>;
      local_88.m_ptr = convexHull.super_dgList<dgConvexHull3DFace>.m_first;
      HVar13 = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
      local_d8 = pHVar10;
      while (local_88.m_ptr != (dgListNode *)0x0) {
        *pHVar10 = ((local_88.m_ptr)->m_info).m_index[0];
        pHVar10[1] = ((local_88.m_ptr)->m_info).m_index[1];
        pHVar10[2] = ((local_88.m_ptr)->m_info).m_index[2];
        dgList<dgConvexHull3DFace>::Iterator::operator++(&local_88,0);
        pHVar10 = pHVar10 + 3;
        HVar13 = HVar13 + -1;
      }
      if (HVar13 != 0) {
        __assert_fail("outCount == triangleCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                      ,0x5e,
                      "HullError HACD::HullLibrary::CreateConvexHull(const HullDesc &, HullResult &)"
                     );
      }
      this_00 = (HullLibrary *)((long)convexHull.m_count * 0xc);
      local_e0 = (HaF32 *)malloc((size_t)this_00);
      BringOutYourDead(this_00,local_b8,convexHull.m_count,local_e0,&ovcount,local_d8,
                       convexHull.super_dgList<dgConvexHull3DFace>.m_count * 3);
      pHVar5 = local_b0;
      local_e8 = (ulong)ovcount * 0xc;
      local_b0->mNumOutputVertices = ovcount;
      __dest = (HaF32 *)malloc(local_e8);
      __n = local_c8;
      pHVar5->mOutputVertices = __dest;
      pHVar5->mNumTriangles = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
      __dest_00 = (HaU32 *)malloc(local_c8);
      pHVar8 = local_e0;
      pHVar5->mIndices = __dest_00;
      memcpy(__dest,local_e0,local_e8);
      pHVar10 = local_d8;
      memcpy(__dest_00,local_d8,__n);
      free(pHVar10);
      free(pHVar8);
      HVar12 = QE_OK;
    }
    free(vertexCloud);
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  else {
    HVar12 = QE_FAIL;
  }
  free(vertices);
  return HVar12;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
										HullResult           &result)         // contains the results
{
	HullError ret = QE_FAIL;

	hacd::HaU32 vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	hacd::HaF32 *vsource  = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*vcount*3 );
	hacd::HaF32 scale[3];
	hacd::HaF32 center[3];

	hacd::HaU32 ovcount;
	bool ok = NormalizeAndCleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale, center, desc.mMaxVertices*2, desc.mUseWuQuantizer ); // normalize point cloud, remove duplicates!
	if ( ok )
	{
		HaF64 *bigVertices = (HaF64 *)HACD_ALLOC(sizeof(HaF64)*3*ovcount);
		for (HaU32 i=0; i<3*ovcount; i++)
		{
			bigVertices[i] = vsource[i];
		}

		dgConvexHull3d convexHull(bigVertices,sizeof(HaF64)*3,ovcount,0.0001f,desc.mMaxVertices);

		if ( convexHull.GetCount() )
		{
			HaF32 *hullVertices = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*convexHull.GetVertexCount() );

			HaF32 *dest = hullVertices;
			for (HaU32 i=0; i<(HaU32)convexHull.GetVertexCount(); i++)
			{
				const dgBigVector &v = convexHull.GetVertex(i);
				dest[0] = (HaF32)v.m_x*scale[0]+center[0];
				dest[1] = (HaF32)v.m_y*scale[1]+center[1];
				dest[2] = (HaF32)v.m_z*scale[2]+center[2];
				dest+=3;
			}

			HaU32 triangleCount = convexHull.GetCount();
			HaU32 *indices = (HaU32*)HACD_ALLOC(triangleCount*sizeof(HaU32)*3);
			HaU32 *destIndices = indices;
			dgList<dgConvexHull3DFace>::Iterator iter(convexHull);
			HaU32 outCount = 0;
			for (iter.Begin(); iter; iter++)
			{
				dgConvexHull3DFace &face = (*iter);
				destIndices[0] = face.m_index[0];
				destIndices[1] = face.m_index[1];
				destIndices[2] = face.m_index[2];
				destIndices+=3;
				outCount++;
			}
			HACD_ASSERT( outCount == triangleCount );

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			hacd::HaF32 *vscratch = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*convexHull.GetVertexCount()*3 );
			BringOutYourDead(hullVertices,convexHull.GetVertexCount(),vscratch, ovcount, indices, triangleCount*3 );

			ret = QE_OK;

			result.mNumOutputVertices	= ovcount;
			result.mOutputVertices		= (hacd::HaF32 *)HACD_ALLOC( sizeof(hacd::HaF32)*ovcount*3);
			result.mNumTriangles		= triangleCount;
			result.mIndices           = (hacd::HaU32 *) HACD_ALLOC( sizeof(hacd::HaU32)*triangleCount*3);
			memcpy(result.mOutputVertices, vscratch, sizeof(hacd::HaF32)*3*ovcount );
			memcpy(result.mIndices, indices, sizeof(hacd::HaU32)*triangleCount*3);

			HACD_FREE(indices);
			HACD_FREE(vscratch);
		}

		HACD_FREE(bigVertices);
	}

	HACD_FREE(vsource);

	return ret;
}